

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O0

void HTS_Label_clear(HTS_Label *label)

{
  HTS_Label *in_RDI;
  HTS_LabelString *next_lstring;
  HTS_LabelString *lstring;
  HTS_LabelString *local_10;
  
  local_10 = in_RDI->head;
  while (local_10 != (HTS_LabelString *)0x0) {
    local_10 = local_10->next;
    HTS_free((void *)0x19ac08);
    HTS_free((void *)0x19ac12);
  }
  HTS_Label_initialize(in_RDI);
  return;
}

Assistant:

void HTS_Label_clear(HTS_Label * label)
{
   HTS_LabelString *lstring, *next_lstring;

   for (lstring = label->head; lstring; lstring = next_lstring) {
      next_lstring = lstring->next;
      HTS_free(lstring->name);
      HTS_free(lstring);
   }
   HTS_Label_initialize(label);
}